

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  bool bVar1;
  hash_t hashCode_00;
  uint uVar2;
  int bucket;
  hash_t hashCode;
  int i;
  EntryType *newEntries;
  int *newBuckets;
  int local_30;
  uint newBucketCount;
  int modIndex;
  uint local_1c;
  int newSize;
  AutoDoResize autoDoResize;
  BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  autoDoResize.lock = (NoResizeLock *)this;
  AutoDoResize::AutoDoResize((AutoDoResize *)&stack0xffffffffffffffe8,(NoResizeLock *)this);
  local_1c = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetNextSize(this->count);
  local_30 = 0x4b;
  newBuckets._4_4_ =
       DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucketSize(local_1c,&local_30);
  newEntries = (EntryType *)0x0;
  _i = (SimpleDictionaryEntry<long,_const_char_*> *)0x0;
  if (newBuckets._4_4_ == this->bucketCount) {
    _i = AllocateEntries(this,local_1c,true);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<long,char_const*>,char_const*,Memory::ArenaAllocator>
              (_i,(long)(int)local_1c,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = _i;
    this->size = local_1c;
    this->modFunctionIndex = local_30;
  }
  else {
    Allocate(this,(int **)&newEntries,(EntryType **)&i,newBuckets._4_4_,local_1c);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<long,char_const*>,char_const*,Memory::ArenaAllocator>
              (_i,(long)(int)local_1c,this->entries,(long)this->count);
    this->modFunctionIndex = local_30;
    for (bucket = 0; bucket < this->count; bucket = bucket + 1) {
      bVar1 = IsFreeEntry(_i + bucket);
      if (!bVar1) {
        hashCode_00 = DefaultHashedEntry<long,char_const*,JsUtil::(anonymous_namespace)::KeyValueEntry>
                      ::GetHashCode<DefaultComparer<long>>
                                ((DefaultHashedEntry<long,char_const*,JsUtil::(anonymous_namespace)::KeyValueEntry>
                                  *)(_i + bucket));
        uVar2 = GetBucket(hashCode_00,newBuckets._4_4_,this->modFunctionIndex);
        _i[bucket].
        super_DefaultHashedEntry<long,_const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
        super_KeyValueEntry<long,_const_char_*>.
        super_ValueEntry<const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_const_char_*>_>
        .super_KeyValueEntryDataLayout2<long,_const_char_*>.next =
             *(int *)((long)&(newEntries->
                             super_DefaultHashedEntry<long,_const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             ).super_KeyValueEntry<long,_const_char_*>.
                             super_ValueEntry<const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_const_char_*>_>
                             .super_KeyValueEntryDataLayout2<long,_const_char_*>.value +
                     (long)(int)uVar2 * 4);
        *(int *)((long)&(newEntries->
                        super_DefaultHashedEntry<long,_const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        ).super_KeyValueEntry<long,_const_char_*>.
                        super_ValueEntry<const_char_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_const_char_*>_>
                        .super_KeyValueEntryDataLayout2<long,_const_char_*>.value +
                (long)(int)uVar2 * 4) = bucket;
      }
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (Type)0x0) {
      DictionaryStats::Resize(this->stats,local_1c,local_1c - this->size);
    }
    this->buckets = (Type)newEntries;
    this->entries = _i;
    this->bucketCount = newBuckets._4_4_;
    this->size = local_1c;
  }
  AutoDoResize::~AutoDoResize((AutoDoResize *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }